

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  undefined8 *puVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  ImU32 IVar10;
  uint uVar11;
  uint uVar12;
  float radius_00;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  bool held;
  bool hovered;
  ImVec2 center;
  ImRect bb;
  bool local_aa;
  bool local_a9;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec4 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  local_a8 = (*pos).x;
  fStack_a4 = (*pos).y;
  local_88 = local_a8 - radius;
  fStack_84 = fStack_a4 - radius;
  fStack_80 = 0.0 - radius;
  fStack_7c = 0.0 - radius;
  local_a8 = radius + local_a8;
  fStack_a4 = radius + fStack_a4;
  fStack_a0 = radius + 0.0;
  fStack_9c = radius + 0.0;
  local_98 = radius;
  uStack_94 = in_XMM0_Db;
  uStack_90 = in_XMM0_Dc;
  uStack_8c = in_XMM0_Dd;
  local_40.Min.x = local_88;
  local_40.Min.y = fStack_84;
  local_40.Max.x = local_a8;
  local_40.Max.y = fStack_a4;
  bVar9 = ButtonBehavior(&local_40,id,&local_a9,&local_aa,0);
  uVar12 = (local_aa ^ 1U) & local_a9 | 0x22;
  uVar11 = 0x24;
  if ((local_a9 & 1U) == 0) {
    uVar11 = uVar12;
  }
  if (local_aa == false) {
    uVar11 = uVar12;
  }
  puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar11 << 4));
  local_68._0_8_ = *puVar1;
  uVar4 = puVar1[1];
  local_68.w = (float)((ulong)uVar4 >> 0x20);
  local_68.z = (float)uVar4;
  local_68.w = (GImGui->Style).Alpha * local_68.w;
  IVar10 = ColorConvertFloat4ToU32(&local_68);
  local_a8 = (local_a8 + local_88) * 0.5;
  fStack_a4 = (fStack_a4 + fStack_84) * 0.5;
  fStack_a0 = (fStack_a0 + fStack_80) * 0.0;
  fStack_9c = (fStack_9c + fStack_7c) * 0.0;
  local_48.y = fStack_a4;
  local_48.x = local_a8;
  radius_00 = 2.0;
  if (2.0 <= local_98) {
    radius_00 = local_98;
  }
  ImDrawList::AddCircleFilled(pIVar2->DrawList,&local_48,radius_00,IVar10,0xc);
  if (local_a9 == true) {
    local_58 = local_98 * 0.7071 + -1.0;
    pIVar3 = pIVar2->DrawList;
    local_88 = local_58 + local_a8;
    fStack_84 = (float)uStack_94;
    fStack_80 = (float)uStack_90;
    fStack_7c = (float)uStack_8c;
    local_98 = local_58 + fStack_a4;
    local_70.y = local_98;
    local_70.x = local_88;
    local_a8 = local_a8 - local_58;
    local_58 = fStack_a4 - local_58;
    fStack_54 = fStack_a4;
    fStack_50 = fStack_a4;
    fStack_4c = fStack_a4;
    local_78.y = local_58;
    local_78.x = local_a8;
    local_68.x = (GImGui->Style).Colors[0].x;
    local_68.y = (GImGui->Style).Colors[0].y;
    uVar5 = (GImGui->Style).Colors[0].z;
    uVar6 = (GImGui->Style).Colors[0].w;
    local_68.w = (GImGui->Style).Alpha * (float)uVar6;
    local_68.z = (float)uVar5;
    IVar10 = ColorConvertFloat4ToU32(&local_68);
    ImDrawList::AddLine(pIVar3,&local_70,&local_78,IVar10,1.0);
    pIVar3 = pIVar2->DrawList;
    local_70.y = local_58;
    local_70.x = local_88;
    local_78.y = local_98;
    local_78.x = local_a8;
    local_68.x = (GImGui->Style).Colors[0].x;
    local_68.y = (GImGui->Style).Colors[0].y;
    uVar7 = (GImGui->Style).Colors[0].z;
    uVar8 = (GImGui->Style).Colors[0].w;
    local_68.w = (GImGui->Style).Alpha * (float)uVar8;
    local_68.z = (float)uVar7;
    IVar10 = ColorConvertFloat4ToU32(&local_68);
    ImDrawList::AddLine(pIVar3,&local_70,&local_78,IVar10,1.0);
  }
  return bVar9;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiWindow* window = GetCurrentWindow();

    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_CloseButtonActive : hovered ? ImGuiCol_CloseButtonHovered : ImGuiCol_CloseButton);
    const ImVec2 center = bb.GetCenter();
    window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), col, 12);

    const float cross_extent = (radius * 0.7071f) - 1.0f;
    if (hovered)
    {
        window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), GetColorU32(ImGuiCol_Text));
        window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), GetColorU32(ImGuiCol_Text));
    }

    return pressed;
}